

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O3

Klass<Foo2,_Foo> * __thiscall
squall::Klass<Foo2,Foo>::func<void(Foo2::*)()>
          (Klass<Foo2,Foo> *this,SQChar *name,offset_in_Foo2_to_subr f)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,name,&local_41);
  func<void(Foo2::*)()>(this,&local_40,f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (Klass<Foo2,_Foo> *)this;
}

Assistant:

Klass<C, Base>& func(const SQChar* name, F f) {
        func(string(name), f);
        return *this;
    }